

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  stbi_uc *psVar1;
  undefined1 auVar2 [64];
  ushort uVar3;
  ulong uVar4;
  byte bVar5;
  stbi_uc sVar6;
  char cVar7;
  stbi__uint16 sVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  stbi__uint16 *data;
  byte *pbVar20;
  stbi_uc *psVar21;
  ulong uVar22;
  stbi_uc *psVar23;
  ulong uVar24;
  uint y_00;
  uint uVar25;
  stbi_uc *psVar26;
  stbi__uint16 *psVar27;
  stbi__uint16 *psVar28;
  uint x_00;
  uint uVar29;
  stbi__uint16 *psVar30;
  long lVar31;
  long in_FS_OFFSET;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float fVar35;
  float fVar36;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [12];
  undefined1 auVar42 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar44 [16];
  undefined1 in_register_000013c4 [12];
  stbi__uint16 *local_138;
  undefined1 auVar37 [16];
  
  iVar9 = stbi__get16be(s);
  uVar10 = stbi__get16be(s);
  if ((uVar10 | iVar9 << 0x10) != 0x38425053) {
    pcVar19 = "not PSD";
    goto LAB_001a2315;
  }
  iVar9 = stbi__get16be(s);
  if (iVar9 != 1) {
    pcVar19 = "wrong version";
    goto LAB_001a2315;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001a2201:
    s->img_buffer = s->img_buffer + 6;
  }
  else {
    iVar9 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (5 < iVar9) goto LAB_001a2201;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar9);
  }
  uVar10 = stbi__get16be(s);
  if (uVar10 < 0x11) {
    iVar9 = stbi__get16be(s);
    iVar11 = stbi__get16be(s);
    iVar12 = stbi__get16be(s);
    iVar13 = stbi__get16be(s);
    iVar14 = stbi__get16be(s);
    if ((iVar14 == 8) || (iVar14 == 0x10)) {
      iVar15 = stbi__get16be(s);
      if (iVar15 == 3) {
        iVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        stbi__skip(s,iVar15 << 0x10 | uVar16);
        iVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        stbi__skip(s,iVar15 << 0x10 | uVar16);
        iVar15 = stbi__get16be(s);
        uVar16 = stbi__get16be(s);
        stbi__skip(s,iVar15 << 0x10 | uVar16);
        uVar16 = stbi__get16be(s);
        if (uVar16 < 2) {
          iVar9 = iVar9 * 0x10000;
          y_00 = iVar9 + iVar11;
          iVar12 = iVar12 * 0x10000;
          x_00 = iVar12 + iVar13;
          iVar15 = stbi__mad3sizes_valid(4,x_00,y_00,0);
          if (iVar15 == 0) {
            pcVar19 = "too large";
          }
          else {
            if (((bpc == 0x10) && (iVar14 == 0x10)) && (uVar16 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,y_00,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(y_00 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar17 = x_00 * y_00;
              if (uVar16 == 0) {
                psVar1 = s->buffer_start;
                auVar32 = vpbroadcastq_avx512f();
                psVar27 = data + 0x7e;
                uVar16 = (iVar11 + iVar9) * (iVar13 + iVar12);
                psVar30 = data + 0x7c;
                uVar22 = 0;
                auVar2 = vmovdqu64_avx512f(auVar32);
                psVar28 = data;
                local_138 = data;
                do {
                  if (uVar22 < uVar10) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar17) {
                        lVar31 = 0;
                        do {
                          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                          iVar15 = stbi__get16be(s);
                          auVar32 = vmovdqu64_avx512f(auVar2);
                          local_138[lVar31 * 4] = (stbi__uint16)iVar15;
                          lVar31 = lVar31 + 1;
                        } while (uVar16 != (uint)lVar31);
                      }
                    }
                    else if (iVar14 == 0x10) {
                      if (0 < (int)uVar17) {
                        lVar31 = 0;
                        do {
                          in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                          iVar15 = stbi__get16be(s);
                          auVar32 = vmovdqu64_avx512f(auVar2);
                          *(char *)(psVar28 + lVar31 * 2) = (char)((uint)iVar15 >> 8);
                          lVar31 = lVar31 + 1;
                        } while (uVar16 != (uint)lVar31);
                      }
                    }
                    else if (0 < (int)uVar17) {
                      lVar31 = 0;
                      do {
                        psVar23 = s->img_buffer;
                        if (psVar23 < s->img_buffer_end) {
LAB_001a346e:
                          s->img_buffer = psVar23 + 1;
                          sVar6 = *psVar23;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                            iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar15 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar15;
                            }
                            auVar32 = vmovdqu64_avx512f(auVar2);
                            psVar23 = s->img_buffer;
                            goto LAB_001a346e;
                          }
                          sVar6 = '\0';
                        }
                        *(stbi_uc *)(psVar28 + lVar31 * 2) = sVar6;
                        lVar31 = lVar31 + 1;
                      } while (uVar16 != (uint)lVar31);
                    }
                  }
                  else if (iVar14 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar17) {
                      sVar8 = -(ushort)(uVar22 == 3);
                      uVar24 = 0;
                      do {
                        auVar33 = vpbroadcastq_avx512f();
                        auVar34 = vporq_avx512f(auVar33,_DAT_001b1680);
                        uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                        if ((uVar4 & 1) != 0) {
                          psVar30[uVar24 * 4 + -0x7c] = sVar8;
                        }
                        if ((uVar4 & 2) != 0) {
                          psVar30[uVar24 * 4 + -0x78] = sVar8;
                        }
                        if ((uVar4 & 4) != 0) {
                          psVar30[uVar24 * 4 + -0x74] = sVar8;
                        }
                        if ((uVar4 & 8) != 0) {
                          psVar30[uVar24 * 4 + -0x70] = sVar8;
                        }
                        if ((uVar4 & 0x10) != 0) {
                          psVar30[uVar24 * 4 + -0x6c] = sVar8;
                        }
                        if ((uVar4 & 0x20) != 0) {
                          psVar30[uVar24 * 4 + -0x68] = sVar8;
                        }
                        if ((uVar4 & 0x40) != 0) {
                          psVar30[uVar24 * 4 + -100] = sVar8;
                        }
                        if ((uVar4 & 0x80) != 0) {
                          psVar30[uVar24 * 4 + -0x60] = sVar8;
                        }
                        auVar34 = vporq_avx512f(auVar33,_DAT_001b1640);
                        uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                        if ((uVar4 & 1) != 0) {
                          psVar30[uVar24 * 4 + -0x5c] = sVar8;
                        }
                        if ((uVar4 & 2) != 0) {
                          psVar30[uVar24 * 4 + -0x58] = sVar8;
                        }
                        if ((uVar4 & 4) != 0) {
                          psVar30[uVar24 * 4 + -0x54] = sVar8;
                        }
                        if ((uVar4 & 8) != 0) {
                          psVar30[uVar24 * 4 + -0x50] = sVar8;
                        }
                        if ((uVar4 & 0x10) != 0) {
                          psVar30[uVar24 * 4 + -0x4c] = sVar8;
                        }
                        if ((uVar4 & 0x20) != 0) {
                          psVar30[uVar24 * 4 + -0x48] = sVar8;
                        }
                        if ((uVar4 & 0x40) != 0) {
                          psVar30[uVar24 * 4 + -0x44] = sVar8;
                        }
                        if ((uVar4 & 0x80) != 0) {
                          psVar30[uVar24 * 4 + -0x40] = sVar8;
                        }
                        auVar34 = vporq_avx512f(auVar33,_DAT_001b1600);
                        uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                        if ((uVar4 & 1) != 0) {
                          psVar30[uVar24 * 4 + -0x3c] = sVar8;
                        }
                        if ((uVar4 & 2) != 0) {
                          psVar30[uVar24 * 4 + -0x38] = sVar8;
                        }
                        if ((uVar4 & 4) != 0) {
                          psVar30[uVar24 * 4 + -0x34] = sVar8;
                        }
                        if ((uVar4 & 8) != 0) {
                          psVar30[uVar24 * 4 + -0x30] = sVar8;
                        }
                        if ((uVar4 & 0x10) != 0) {
                          psVar30[uVar24 * 4 + -0x2c] = sVar8;
                        }
                        if ((uVar4 & 0x20) != 0) {
                          psVar30[uVar24 * 4 + -0x28] = sVar8;
                        }
                        if ((uVar4 & 0x40) != 0) {
                          psVar30[uVar24 * 4 + -0x24] = sVar8;
                        }
                        if ((uVar4 & 0x80) != 0) {
                          psVar30[uVar24 * 4 + -0x20] = sVar8;
                        }
                        auVar33 = vporq_avx512f(auVar33,_DAT_001b15c0);
                        uVar4 = vpcmpuq_avx512f(auVar33,auVar32,2);
                        if ((uVar4 & 1) != 0) {
                          psVar30[uVar24 * 4 + -0x1c] = sVar8;
                        }
                        if ((uVar4 & 2) != 0) {
                          psVar30[uVar24 * 4 + -0x18] = sVar8;
                        }
                        if ((uVar4 & 4) != 0) {
                          psVar30[uVar24 * 4 + -0x14] = sVar8;
                        }
                        if ((uVar4 & 8) != 0) {
                          psVar30[uVar24 * 4 + -0x10] = sVar8;
                        }
                        if ((uVar4 & 0x10) != 0) {
                          psVar30[uVar24 * 4 + -0xc] = sVar8;
                        }
                        if ((uVar4 & 0x20) != 0) {
                          psVar30[uVar24 * 4 + -8] = sVar8;
                        }
                        if ((uVar4 & 0x40) != 0) {
                          psVar30[uVar24 * 4 + -4] = sVar8;
                        }
                        if ((uVar4 & 0x80) != 0) {
                          psVar30[uVar24 * 4] = sVar8;
                        }
                        uVar24 = uVar24 + 0x20;
                      } while (((ulong)uVar16 + 0x1f & 0xffffffffffffffe0) != uVar24);
                    }
                  }
                  else if (0 < (int)uVar17) {
                    cVar7 = -(uVar22 == 3);
                    uVar24 = 0;
                    do {
                      auVar33 = vpbroadcastq_avx512f();
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1680);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x7e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x7c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x7a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x78) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x76) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x74) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x72) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x70) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1640);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x6e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x6c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x6a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x68) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x66) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -100) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x62) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x60) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1600);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x5e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x5c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x5a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x58) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x56) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x54) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x52) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x50) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b15c0);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x4e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x4c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x4a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x48) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x46) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x44) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x42) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x40) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1580);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x3e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x3c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x3a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x38) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x36) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x34) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x32) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x30) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1540);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x2e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x2c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x2a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x28) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x26) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x24) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x22) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x20) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1500);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x1e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x1c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x1a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x18) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x16) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x14) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x12) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x10) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar33,_DAT_001b14c0);
                      uVar4 = vpcmpuq_avx512f(auVar33,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0xe) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0xc) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -10) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -8) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -6) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -4) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -2) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2) = cVar7;
                      }
                      uVar24 = uVar24 + 0x40;
                    } while (((ulong)uVar16 + 0x3f & 0xffffffffffffffc0) != uVar24);
                  }
                  auVar43 = in_ZMM5._4_12_;
                  uVar22 = uVar22 + 1;
                  psVar27 = (stbi__uint16 *)((long)psVar27 + 1);
                  psVar30 = psVar30 + 1;
                  psVar28 = (stbi__uint16 *)((long)psVar28 + 1);
                  local_138 = local_138 + 1;
                } while (uVar22 != 4);
              }
              else {
                stbi__skip(s,uVar10 * y_00 * 2);
                psVar1 = s->buffer_start;
                psVar23 = s->buffer_start + 1;
                auVar32 = vpbroadcastq_avx512f();
                psVar27 = data + 0x7e;
                uVar22 = 0;
                auVar2 = vmovdqu64_avx512f(auVar32);
                do {
                  if (uVar22 < uVar10) {
                    if (0 < (int)uVar17) {
                      psVar26 = (stbi_uc *)((long)data + uVar22);
                      iVar14 = 0;
                      uVar16 = uVar17;
                      do {
                        pbVar20 = s->img_buffer;
                        if (pbVar20 < s->img_buffer_end) {
LAB_001a2557:
                          s->img_buffer = pbVar20 + 1;
                          bVar5 = *pbVar20;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                            iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                            if (iVar15 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar23;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar1;
                              s->img_buffer_end = psVar1 + iVar15;
                            }
                            auVar32 = vmovdqu64_avx512f(auVar2);
                            pbVar20 = s->img_buffer;
                            goto LAB_001a2557;
                          }
                          bVar5 = 0;
                        }
                        if (bVar5 != 0x80) {
                          uVar29 = (uint)bVar5;
                          if ((char)bVar5 < '\0') {
                            uVar25 = 0x101 - uVar29;
                            if (uVar25 <= uVar16) {
                              psVar21 = s->img_buffer;
                              if (psVar21 < s->img_buffer_end) {
LAB_001a26b6:
                                s->img_buffer = psVar21 + 1;
                                sVar6 = *psVar21;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                                  iVar15 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen)
                                  ;
                                  if (iVar15 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar23;
                                    s->buffer_start[0] = '\0';
                                  }
                                  else {
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar1 + iVar15;
                                  }
                                  auVar32 = vmovdqu64_avx512f(auVar2);
                                  psVar21 = s->img_buffer;
                                  goto LAB_001a26b6;
                                }
                                sVar6 = '\0';
                              }
                              iVar15 = uVar29 - 0x101;
                              do {
                                *psVar26 = sVar6;
                                psVar26 = psVar26 + 4;
                                iVar15 = iVar15 + 1;
                              } while (iVar15 != 0);
                              iVar14 = iVar14 + uVar25;
                            }
                            if (uVar25 <= uVar16) goto LAB_001a26e2;
                          }
                          else if (bVar5 < uVar16) {
                            iVar15 = uVar29 + 1;
                            do {
                              psVar21 = s->img_buffer;
                              if (psVar21 < s->img_buffer_end) {
LAB_001a25ff:
                                s->img_buffer = psVar21 + 1;
                                sVar6 = *psVar21;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
                                  iVar18 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen)
                                  ;
                                  if (iVar18 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar23;
                                    s->buffer_start[0] = '\0';
                                  }
                                  else {
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar1 + iVar18;
                                  }
                                  auVar32 = vmovdqu64_avx512f(auVar2);
                                  psVar21 = s->img_buffer;
                                  goto LAB_001a25ff;
                                }
                                sVar6 = '\0';
                              }
                              *psVar26 = sVar6;
                              psVar26 = psVar26 + 4;
                              iVar15 = iVar15 + -1;
                            } while (iVar15 != 0);
                            iVar14 = iVar14 + uVar29 + 1;
                            goto LAB_001a26e2;
                          }
                          free(data);
                          pcVar19 = "corrupt";
                          goto LAB_001a2315;
                        }
LAB_001a26e2:
                        uVar16 = uVar17 - iVar14;
                      } while (uVar16 != 0 && iVar14 <= (int)uVar17);
                    }
                  }
                  else if (0 < (int)uVar17) {
                    cVar7 = -(uVar22 == 3);
                    uVar24 = 0;
                    do {
                      auVar33 = vpbroadcastq_avx512f();
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1680);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x7e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x7c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x7a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x78) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x76) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x74) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x72) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x70) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1640);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x6e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x6c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x6a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x68) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x66) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -100) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x62) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x60) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1600);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x5e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x5c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x5a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x58) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x56) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x54) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x52) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x50) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b15c0);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x4e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x4c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x4a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x48) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x46) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x44) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x42) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x40) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1580);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x3e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x3c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x3a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x38) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x36) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x34) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x32) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x30) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1540);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x2e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x2c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x2a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x28) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x26) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x24) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x22) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x20) = cVar7;
                      }
                      auVar34 = vporq_avx512f(auVar33,_DAT_001b1500);
                      uVar4 = vpcmpuq_avx512f(auVar34,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x1e) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x1c) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x1a) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x18) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x16) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x14) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x12) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0x10) = cVar7;
                      }
                      auVar33 = vporq_avx512f(auVar33,_DAT_001b14c0);
                      uVar4 = vpcmpuq_avx512f(auVar33,auVar32,2);
                      if ((uVar4 & 1) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0xe) = cVar7;
                      }
                      if ((uVar4 & 2) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -0xc) = cVar7;
                      }
                      if ((uVar4 & 4) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -10) = cVar7;
                      }
                      if ((uVar4 & 8) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -8) = cVar7;
                      }
                      if ((uVar4 & 0x10) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -6) = cVar7;
                      }
                      if ((uVar4 & 0x20) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -4) = cVar7;
                      }
                      if ((uVar4 & 0x40) != 0) {
                        *(char *)(psVar27 + uVar24 * 2 + -2) = cVar7;
                      }
                      if ((uVar4 & 0x80) != 0) {
                        *(char *)(psVar27 + uVar24 * 2) = cVar7;
                      }
                      uVar24 = uVar24 + 0x40;
                    } while (((ulong)(uint)((iVar11 + iVar9) * (iVar13 + iVar12)) + 0x3f &
                             0xffffffffffffffc0) != uVar24);
                  }
                  auVar43 = in_ZMM5._4_12_;
                  uVar22 = uVar22 + 1;
                  psVar27 = (stbi__uint16 *)((long)psVar27 + 1);
                } while (uVar22 != 4);
              }
              if (3 < uVar10) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar17) {
                    uVar22 = 0;
                    do {
                      uVar3 = data[uVar22 * 4 + 3];
                      if ((uVar3 != 0) && (uVar3 != 0xffff)) {
                        fVar35 = 1.0 / ((float)uVar3 / 65535.0);
                        fVar36 = (1.0 - fVar35) * 65535.0;
                        auVar39 = vpmovzxwd_avx(ZEXT416(*(uint *)(data + uVar22 * 4)));
                        auVar39 = vcvtdq2ps_avx(auVar39);
                        auVar42._4_4_ = fVar35;
                        auVar42._0_4_ = fVar35;
                        auVar42._8_4_ = fVar35;
                        auVar42._12_4_ = fVar35;
                        auVar44._4_4_ = fVar36;
                        auVar44._0_4_ = fVar36;
                        auVar44._8_4_ = fVar36;
                        auVar44._12_4_ = fVar36;
                        auVar39 = vfmadd231ps_fma(auVar44,auVar39,auVar42);
                        auVar37._0_4_ = (int)auVar39._0_4_;
                        auVar37._4_4_ = (int)auVar39._4_4_;
                        auVar37._8_4_ = (int)auVar39._8_4_;
                        auVar37._12_4_ = (int)auVar39._12_4_;
                        auVar39 = vpshuflw_avx(auVar37,0xe8);
                        *(int *)(data + uVar22 * 4) = auVar39._0_4_;
                        auVar38._0_4_ = (float)data[uVar22 * 4 + 2];
                        auVar38._4_12_ = in_register_000013c4;
                        auVar39 = vfmadd213ss_fma(auVar38,ZEXT416((uint)fVar35),
                                                  ZEXT416((uint)fVar36));
                        data[uVar22 * 4 + 2] = (stbi__uint16)(int)auVar39._0_4_;
                      }
                      uVar22 = uVar22 + 1;
                    } while ((uint)((iVar11 + iVar9) * (iVar13 + iVar12)) != uVar22);
                  }
                }
                else if (0 < (int)uVar17) {
                  uVar22 = 0;
                  do {
                    bVar5 = *(byte *)((long)data + uVar22 * 4 + 3);
                    if ((bVar5 != 0) && (bVar5 != 0xff)) {
                      fVar36 = 1.0 / ((float)bVar5 / 255.0);
                      auVar37 = ZEXT416((uint)fVar36);
                      fVar36 = (1.0 - fVar36) * 255.0;
                      auVar39._0_4_ = (float)(byte)data[uVar22 * 2];
                      auVar39._4_12_ = auVar43;
                      auVar39 = vfmadd213ss_fma(auVar39,auVar37,ZEXT416((uint)fVar36));
                      *(char *)(data + uVar22 * 2) = (char)(int)auVar39._0_4_;
                      auVar40._0_4_ = (float)*(byte *)((long)data + uVar22 * 4 + 1);
                      auVar40._4_12_ = auVar43;
                      auVar39 = vfmadd213ss_fma(auVar40,auVar37,ZEXT416((uint)fVar36));
                      *(char *)((long)data + uVar22 * 4 + 1) = (char)(int)auVar39._0_4_;
                      auVar41._0_4_ = (float)(byte)data[uVar22 * 2 + 1];
                      auVar41._4_12_ = auVar43;
                      auVar39 = vfmadd213ss_fma(auVar41,auVar37,ZEXT416((uint)fVar36));
                      *(char *)(data + uVar22 * 2 + 1) = (char)(int)auVar39._0_4_;
                    }
                    uVar22 = uVar22 + 1;
                  } while ((uint)((iVar11 + iVar9) * (iVar13 + iVar12)) != uVar22);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,y_00);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,y_00);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = y_00;
              *x = x_00;
              return data;
            }
            pcVar19 = "outofmem";
          }
        }
        else {
          pcVar19 = "bad compression";
        }
      }
      else {
        pcVar19 = "wrong color format";
      }
    }
    else {
      pcVar19 = "unsupported bit depth";
    }
  }
  else {
    pcVar19 = "wrong channel count";
  }
LAB_001a2315:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar19;
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}